

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oscurses.cc
# Opt level: O1

int timedGetcRaw(bool showCursor,int timeout,bool *timedOut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  undefined1 *puVar4;
  undefined7 in_register_00000039;
  
  puVar4 = (undefined1 *)CONCAT44(in_register_00000034,timeout);
  if (timedGetcRaw(bool,int,bool*)::done == '\x01') {
    timedGetcRaw(bool,int,bool*)::done = '\0';
    return timedGetcRaw::extKey;
  }
  iVar3 = (int)CONCAT71(in_register_00000039,showCursor);
  uVar1 = (*globalApp->_vptr_FrobTadsApplication[8])
                    (globalApp,1,CONCAT71(in_register_00000039,showCursor) & 0xffffffff);
  timedGetcRaw::extKey = 0;
  if (uVar1 == 0xffffffff) {
    if (-1 < iVar3) {
      if (puVar4 == (undefined1 *)0x0) {
        timedGetcRaw::extKey = 0;
        return 0;
      }
      *puVar4 = 1;
      return 0;
    }
    timedGetcRaw::extKey = 0x20;
  }
  if (puVar4 != (undefined1 *)0x0 && -1 < iVar3) {
    *puVar4 = 0;
  }
  if ((int)uVar1 < 0x148) {
    switch(uVar1) {
    case 0x102:
      iVar3 = 2;
      break;
    case 0x103:
      iVar3 = 1;
      break;
    case 0x104:
      iVar3 = 4;
      break;
    case 0x105:
      iVar3 = 3;
      break;
    case 0x106:
      iVar3 = 6;
      break;
    case 0x107:
switchD_001e8e12_caseD_a:
      return 8;
    case 0x108:
switchD_001e8da5_caseD_108:
      iVar3 = timedGetcRaw::extKey;
      if (0xff < uVar1) {
        return 0x20;
      }
      break;
    case 0x109:
      iVar3 = 0xf;
      break;
    case 0x10a:
      iVar3 = 0x10;
      break;
    case 0x10b:
      iVar3 = 0x11;
      break;
    case 0x10c:
      iVar3 = 0x12;
      break;
    case 0x10d:
      iVar3 = 0x13;
      break;
    case 0x10e:
      iVar3 = 0x14;
      break;
    case 0x10f:
      iVar3 = 0x15;
      break;
    case 0x110:
      iVar3 = 0x16;
      break;
    case 0x111:
      iVar3 = 0x17;
      break;
    case 0x112:
      iVar3 = 0x18;
      break;
    default:
      uVar2 = 0xd;
      switch(uVar1) {
      case 8:
        goto switchD_001e8e12_caseD_a;
      case 9:
        iVar3 = 0x1a;
        break;
      case 10:
      case 0xd:
        goto switchD_001e8e12_caseD_a;
      case 0xb:
      case 0xc:
        goto switchD_001e8da5_caseD_108;
      default:
        iVar3 = 0x20;
        if (uVar1 != 0) goto switchD_001e8da5_caseD_108;
      }
    }
  }
  else {
    switch(uVar1) {
    case 0x148:
      iVar3 = 8;
      break;
    case 0x149:
    case 0x14b:
    case 0x14c:
    case 0x14d:
    case 0x14e:
    case 0x150:
    case 0x151:
      goto switchD_001e8da5_caseD_108;
    case 0x14a:
      iVar3 = 9;
      break;
    case 0x14f:
      iVar3 = 7;
      break;
    case 0x152:
      iVar3 = 0xc;
      break;
    case 0x153:
      iVar3 = 0xb;
      break;
    default:
      if (uVar1 == 0x157) {
        return 0xd;
      }
      if (uVar1 != 0x168) goto switchD_001e8da5_caseD_108;
      iVar3 = 5;
    }
  }
  timedGetcRaw::extKey = iVar3;
  uVar2 = uVar1;
  if (timedGetcRaw::extKey != 0) {
    timedGetcRaw(bool,int,bool*)::done = '\x01';
    uVar2 = 0;
  }
switchD_001e8e12_caseD_a:
  return uVar2;
}

Assistant:

static int
timedGetcRaw( bool showCursor, int timeout = -1, bool* timedOut = 0)
{
    // If `done' is false, it means that we have been previously
    // called and returned 0, so this time we should return the
    // extended key-code we stored last time in `extKey'.
    static bool done = true;
    static int extKey;

    if (not done) {
        // We have a pending return from our last call.  Prepare to do a
        // normal read on our next call and return the pending result.
        done = true;
        return extKey;
    }

    // Read a character.
    int c = globalApp->getRawChar(showCursor, timeout);
    extKey = 0;

    if (c == ERR) {
        if (timeout > -1) {
            // The operation timed out.
            if (timedOut != 0) *timedOut = true;
            return 0;
        }
        // Paranoia (ERR is only returned to indicate that the operation
        // timed out).  Something else happened.  Prepare to return an EOF
        // on our next call.
        extKey = CMD_EOF;
    }

    // If a timeout was specified and the caller wants to know, report that
    // no timeout occured.
    if (timeout > -1 and timedOut != 0) *timedOut = false;
        
    switch (c) {
      // Paranoia.
      // ERR should always be 0, and therefore already handled.  Anyway, we
      // explicitly check for 0 here just in case ERR != 0.
      case 0:         extKey = CMD_EOF; break;
      // A Tab is not an extended character, but Tads requires that it is
      // handled as one.
      case '\t':      extKey = CMD_TAB; break;
      case '\n':
      case '\r':
      case KEY_ENTER: return 13;
      case KEY_DOWN:  extKey = CMD_DOWN; break;
      case KEY_UP:    extKey = CMD_UP; break;
      case KEY_LEFT:  extKey = CMD_LEFT; break;
      case KEY_RIGHT: extKey = CMD_RIGHT; break;
      case KEY_HOME:  extKey = CMD_HOME; break;
      // We don't return '\b' because of paranoia; some systems might not
      // use ASCII code 8 for '\b'.
      case '\b':
      case KEY_BACKSPACE: return 8;
      case KEY_F(1):  extKey = CMD_F1; break;
      case KEY_F(2):  extKey = CMD_F2; break;
      case KEY_F(3):  extKey = CMD_F3; break;
      case KEY_F(4):  extKey = CMD_F4; break;
      case KEY_F(5):  extKey = CMD_F5; break;
      case KEY_F(6):  extKey = CMD_F6; break;
      case KEY_F(7):  extKey = CMD_F7; break;
      case KEY_F(8):  extKey = CMD_F8; break;
      case KEY_F(9):  extKey = CMD_F9; break;
      case KEY_F(10): extKey = CMD_F10; break;
      case KEY_DL:    extKey = CMD_KILL; break;
      case KEY_DC:    extKey = CMD_DEL; break;
      case KEY_EOL:   extKey = CMD_DEOL; break;
      case KEY_NPAGE: extKey = CMD_PGDN; break;
      case KEY_PPAGE: extKey = CMD_PGUP; break;
      case KEY_END:   extKey = CMD_END; break;
      default:
        // TODO: This assumes that the system only returns unsigned
        // characters for "normal" inputs.
        if (c < 0 or c > 255) {
            // Who knows?  Report a space so that there's at least some
            // feedback.
            return ' ';
        }
    }

    if (extKey == 0) {
        // It's a normal ASCII code (this includes Escape, which has code
        // 27).
        return c;
    }

    // Prepare to return the extended key-code on our next call.
    done = false;
    return 0;
}